

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  int *piVar7;
  void **ppvVar8;
  long *plVar9;
  long lVar10;
  void **ppvVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  
  iVar4 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    iVar4 = 0;
    if (loop->inotify_fd == -1) {
      iVar4 = inotify_init1(0x80800);
      if (iVar4 < 0) {
        piVar7 = __errno_location();
        iVar4 = -*piVar7;
      }
      else {
        loop->inotify_fd = iVar4;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar4);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
        iVar4 = 0;
      }
    }
    if (iVar4 == 0) {
      iVar4 = inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
      if (iVar4 == -1) {
        piVar7 = __errno_location();
        iVar4 = -*piVar7;
      }
      else {
        for (plVar6 = (long *)handle->loop->inotify_watchers; plVar6 != (long *)0x0;
            plVar6 = (long *)*plVar6) {
          if ((int)plVar6[8] <= iVar4) {
            if (iVar4 <= (int)plVar6[8]) goto LAB_0019bcb5;
            plVar6 = plVar6 + 1;
          }
        }
        plVar6 = (long *)0x0;
LAB_0019bcb5:
        if (plVar6 == (long *)0x0) {
          sVar5 = strlen(path);
          plVar6 = (long *)uv__malloc(sVar5 + 0x49);
          if (plVar6 == (long *)0x0) {
            return -0xc;
          }
          *(int *)(plVar6 + 8) = iVar4;
          memcpy(plVar6 + 9,path,sVar5 + 1);
          plVar6[7] = (long)(plVar6 + 9);
          plVar6[4] = (long)(plVar6 + 4);
          plVar6[5] = (long)(plVar6 + 4);
          *(undefined4 *)(plVar6 + 6) = 0;
          plVar14 = (long *)handle->loop->inotify_watchers;
          if (plVar14 == (long *)0x0) {
            lVar10 = 8;
            plVar9 = (long *)0x0;
          }
          else {
            do {
              plVar9 = plVar14;
              iVar2 = (int)plVar9[8];
              plVar13 = plVar9;
              if (iVar2 <= iVar4) {
                if (iVar4 <= iVar2) goto LAB_0019bf65;
                plVar13 = plVar9 + 1;
              }
              plVar14 = (long *)*plVar13;
            } while ((long *)*plVar13 != (long *)0x0);
            lVar10 = (ulong)(iVar2 <= iVar4) << 3;
          }
          ppvVar8 = &handle->loop->inotify_watchers;
          plVar6[2] = (long)plVar9;
          *plVar6 = 0;
          plVar6[1] = 0;
          ppvVar11 = (void **)(lVar10 + (long)plVar9);
          if (plVar9 == (long *)0x0) {
            ppvVar11 = ppvVar8;
          }
          *(undefined4 *)(plVar6 + 3) = 1;
          *ppvVar11 = plVar6;
          plVar14 = (long *)plVar6[2];
          plVar9 = plVar6;
          while ((plVar14 != (long *)0x0 && ((int)plVar14[3] == 1))) {
            plVar13 = (long *)plVar14[2];
            plVar15 = (long *)*plVar13;
            plVar12 = plVar9;
            if (plVar14 == plVar15) {
              plVar15 = (long *)plVar13[1];
              if ((plVar15 == (long *)0x0) || ((int)plVar15[3] != 1)) {
                plVar15 = (long *)plVar14[1];
                if (plVar15 == plVar9) {
                  lVar10 = *plVar15;
                  plVar14[1] = lVar10;
                  if (lVar10 != 0) {
                    *(long **)(*plVar15 + 0x10) = plVar14;
                  }
                  lVar10 = plVar14[2];
                  plVar15[2] = lVar10;
                  ppvVar11 = ppvVar8;
                  if (lVar10 != 0) {
                    ppvVar11 = (void **)((undefined8 *)plVar14[2] +
                                        (plVar14 != *(long **)plVar14[2]));
                  }
                  *ppvVar11 = plVar15;
                  *plVar15 = (long)plVar14;
                  plVar14[2] = (long)plVar15;
                  plVar12 = plVar14;
                  plVar14 = plVar9;
                }
                *(undefined4 *)(plVar14 + 3) = 0;
                *(undefined4 *)(plVar13 + 3) = 1;
                plVar14 = (long *)*plVar13;
                lVar10 = plVar14[1];
                *plVar13 = lVar10;
                if (lVar10 != 0) {
                  *(long **)(plVar14[1] + 0x10) = plVar13;
                }
                lVar10 = plVar13[2];
                plVar14[2] = lVar10;
                ppvVar11 = ppvVar8;
                if (lVar10 != 0) {
                  ppvVar11 = (void **)((undefined8 *)plVar13[2] + (plVar13 != *(long **)plVar13[2]))
                  ;
                }
                *ppvVar11 = plVar14;
                plVar14[1] = (long)plVar13;
                goto LAB_0019bf47;
              }
LAB_0019bdf1:
              *(undefined4 *)(plVar15 + 3) = 0;
              *(undefined4 *)(plVar14 + 3) = 0;
              *(undefined4 *)(plVar13 + 3) = 1;
            }
            else {
              if ((plVar15 != (long *)0x0) && ((int)plVar15[3] == 1)) goto LAB_0019bdf1;
              plVar15 = (long *)*plVar14;
              if (plVar15 == plVar9) {
                lVar10 = plVar15[1];
                *plVar14 = lVar10;
                if (lVar10 != 0) {
                  *(long **)(plVar15[1] + 0x10) = plVar14;
                }
                lVar10 = plVar14[2];
                plVar15[2] = lVar10;
                ppvVar11 = ppvVar8;
                if (lVar10 != 0) {
                  ppvVar11 = (void **)((undefined8 *)plVar14[2] + (plVar14 != *(long **)plVar14[2]))
                  ;
                }
                *ppvVar11 = plVar15;
                plVar15[1] = (long)plVar14;
                plVar14[2] = (long)plVar15;
                plVar12 = plVar14;
                plVar14 = plVar9;
              }
              *(undefined4 *)(plVar14 + 3) = 0;
              *(undefined4 *)(plVar13 + 3) = 1;
              plVar14 = (long *)plVar13[1];
              lVar10 = *plVar14;
              plVar13[1] = lVar10;
              if (lVar10 != 0) {
                *(long **)(*plVar14 + 0x10) = plVar13;
              }
              lVar10 = plVar13[2];
              plVar14[2] = lVar10;
              ppvVar11 = ppvVar8;
              if (lVar10 != 0) {
                ppvVar11 = (void **)((undefined8 *)plVar13[2] + (plVar13 != *(long **)plVar13[2]));
              }
              *ppvVar11 = plVar14;
              *plVar14 = (long)plVar13;
LAB_0019bf47:
              plVar13[2] = (long)plVar14;
              plVar13 = plVar12;
            }
            plVar9 = plVar13;
            plVar14 = (long *)plVar13[2];
          }
          *(undefined4 *)((long)*ppvVar8 + 0x18) = 0;
        }
LAB_0019bf65:
        uVar3 = handle->flags;
        if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->watchers[0] = plVar6 + 4;
        plVar14 = (long *)plVar6[5];
        handle->watchers[1] = plVar14;
        *plVar14 = (long)handle->watchers;
        plVar6[5] = (long)handle->watchers;
        handle->path = (char *)plVar6[7];
        handle->cb = cb;
        handle->wd = iVar4;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}